

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O3

GherkinLine * GherkinLine_new(wchar_t *line_text,wchar_t line_number)

{
  _Bool _Var1;
  GherkinLine *pGVar2;
  int iVar3;
  wchar_t wchar;
  
  pGVar2 = (GherkinLine *)malloc(0x18);
  pGVar2->line_number = line_number;
  pGVar2->indent = 0;
  pGVar2->line_text = line_text;
  wchar = *line_text;
  if (wchar != L'\0') {
    iVar3 = 1;
    do {
      _Var1 = StringUtilities_is_whitespace(wchar);
      if (!_Var1) break;
      pGVar2->indent = iVar3;
      wchar = line_text[1];
      line_text = line_text + 1;
      iVar3 = iVar3 + 1;
    } while (wchar != L'\0');
  }
  pGVar2->trimmed_line = line_text;
  return pGVar2;
}

Assistant:

const GherkinLine* GherkinLine_new(const wchar_t* line_text, int line_number) {
    GherkinLine* line = (GherkinLine*)malloc(sizeof(GherkinLine));
    line->line_number = line_number;
    line->indent = 0;
    line->line_text = line_text;
    line->trimmed_line = line_text;
    while (line->trimmed_line[0] != '\0' && StringUtilities_is_whitespace(line->trimmed_line[0])) {
        ++line->trimmed_line;
        ++line->indent;
    }
    return line;
}